

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketInitiator::doConnect(ThreadedSocketInitiator *this,SessionID *s,Dictionary *d)

{
  socket_handle s_00;
  undefined8 uVar1;
  Dictionary *sessionID;
  bool bVar2;
  int iVar3;
  Session *pSVar4;
  ThreadedSocketConnection *this_00;
  Log *pLog;
  pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *this_01;
  int value;
  int value_00;
  int value_01;
  exception *anon_var_0;
  thread_id thread;
  Locker l;
  ThreadPair *pair;
  ThreadedSocketConnection *pConnection;
  string local_258;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  socket_handle local_f8;
  allocator<char> local_f1;
  socket_handle socket;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  HostDetails host;
  Log *log;
  Session *local_28;
  Session *session;
  Dictionary *d_local;
  SessionID *s_local;
  ThreadedSocketInitiator *this_local;
  
  session = (Session *)d;
  d_local = (Dictionary *)s;
  s_local = (SessionID *)this;
  pSVar4 = Session::lookupSession(s);
  local_28 = pSVar4;
  UtcTimeStamp::now();
  bVar2 = Session::isSessionTime(pSVar4,(UtcTimeStamp *)&log);
  UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&log);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    host._72_8_ = Session::getLog(local_28);
    HostDetailsProvider::getHost
              ((HostDetails *)local_a8,&this->m_hostDetailsProvider,(SessionID *)d_local,
               (Dictionary *)session);
    pSVar4 = session;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"ReconnectInterval",&local_c9);
    bVar2 = Dictionary::has((Dictionary *)pSVar4,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
    pSVar4 = session;
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&socket,"ReconnectInterval",&local_f1);
      iVar3 = Dictionary::getInt((Dictionary *)pSVar4,(string *)&socket);
      this->m_reconnectInterval = iVar3;
      std::__cxx11::string::~string((string *)&socket);
      std::allocator<char>::~allocator(&local_f1);
    }
    local_f8 = socket_createConnector();
    if ((this->m_noDelay & 1U) != 0) {
      socket_setsockopt(local_f8,1);
    }
    if (this->m_sendBufSize != 0) {
      socket_setsockopt(local_f8,7,this->m_sendBufSize);
    }
    if (this->m_rcvBufSize != 0) {
      socket_setsockopt(local_f8,8,this->m_rcvBufSize);
    }
    Initiator::setPending(&this->super_Initiator,(SessionID *)d_local);
    uVar1 = host._72_8_;
    std::operator+(&local_218,"Connecting to ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
    std::operator+(&local_1f8,&local_218," on port ");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_238,(IntTConvertor<int> *)(ulong)(ushort)host.address.field_2._8_2_,value);
    std::operator+(&local_1d8,&local_1f8,&local_238);
    std::operator+(&local_1b8,&local_1d8," (Source ");
    std::operator+(&local_198,&local_1b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&host.port);
    std::operator+(&local_178,&local_198,":");
    IntTConvertor<int>::convert_abi_cxx11_
              (&local_258,(IntTConvertor<int> *)(ulong)(ushort)host.sourceAddress.field_2._8_2_,
               value_00);
    std::operator+(&local_158,&local_178,&local_258);
    std::operator+(&local_138,&local_158,") ReconnectInterval=");
    IntTConvertor<int>::convert_abi_cxx11_
              ((string *)&pConnection,(IntTConvertor<int> *)(ulong)(uint)this->m_reconnectInterval,
               value_01);
    std::operator+(&local_118,&local_138,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pConnection
                  );
    (**(code **)(*(long *)uVar1 + 0x30))(uVar1,&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&pConnection);
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::__cxx11::string::~string((string *)&local_218);
    this_00 = (ThreadedSocketConnection *)operator_new(0x20c8);
    sessionID = d_local;
    s_00 = local_f8;
    pLog = Initiator::getLog(&this->super_Initiator);
    ThreadedSocketConnection::ThreadedSocketConnection
              (this_00,(SessionID *)sessionID,s_00,(string *)local_a8,host.address.field_2._8_2_,
               pLog,(string *)&host.port,host.sourceAddress.field_2._8_2_);
    pair = (ThreadPair *)this_00;
    this_01 = (pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *)
              operator_new(0x10);
    l.m_mutex = (Mutex *)this;
    std::pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*>::
    pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*&,_true>
              (this_01,(ThreadedSocketInitiator **)&l,(ThreadedSocketConnection **)&pair);
    Locker::Locker((Locker *)&thread,&this->m_mutex);
    bVar2 = thread_spawn(socketThread,this_01,(thread_id *)&anon_var_0);
    if (bVar2) {
      addThread(this,local_f8,(thread_id)anon_var_0);
    }
    else {
      if (this_01 != (pair<FIX::ThreadedSocketInitiator_*,_FIX::ThreadedSocketConnection_*> *)0x0) {
        operator_delete(this_01,0x10);
      }
      (*(code *)*(_Base_ptr *)
                 ((long)&(pair->first->super_Initiator).m_sessions._M_t._M_impl.
                         super__Rb_tree_header._M_header + 8))();
      if (pair != (ThreadPair *)0x0) {
        (**(code **)&(pair->first->super_Initiator).m_sessions._M_t._M_impl)();
      }
      Initiator::setDisconnected(&this->super_Initiator,(SessionID *)d_local);
    }
    Locker::~Locker((Locker *)&thread);
    HostDetails::~HostDetails((HostDetails *)local_a8);
  }
  return;
}

Assistant:

void ThreadedSocketInitiator::doConnect(const SessionID &s, const Dictionary &d) {
  try {
    Session *session = Session::lookupSession(s);
    if (!session->isSessionTime(UtcTimeStamp::now())) {
      return;
    }

    Log *log = session->getLog();

    HostDetails host = m_hostDetailsProvider.getHost(s, d);
    if (d.has(RECONNECT_INTERVAL)) // ReconnectInterval in [SESSION]
    {
      m_reconnectInterval = d.getInt(RECONNECT_INTERVAL);
    }

    socket_handle socket = socket_createConnector();
    if (m_noDelay) {
      socket_setsockopt(socket, TCP_NODELAY);
    }
    if (m_sendBufSize) {
      socket_setsockopt(socket, SO_SNDBUF, m_sendBufSize);
    }
    if (m_rcvBufSize) {
      socket_setsockopt(socket, SO_RCVBUF, m_rcvBufSize);
    }

    setPending(s);
    log->onEvent(
        "Connecting to " + host.address + " on port " + IntConvertor::convert((unsigned short)host.port) + " (Source "
        + host.sourceAddress + ":" + IntConvertor::convert((unsigned short)host.sourcePort)
        + ") ReconnectInterval=" + IntConvertor::convert((int)m_reconnectInterval));

    ThreadedSocketConnection *pConnection = new ThreadedSocketConnection(
        s,
        socket,
        host.address,
        host.port,
        getLog(),
        host.sourceAddress,
        host.sourcePort);

    ThreadPair *pair = new ThreadPair(this, pConnection);

    {
      Locker l(m_mutex);
      thread_id thread;
      if (thread_spawn(&socketThread, pair, thread)) {
        addThread(socket, thread);
      } else {
        delete pair;
        pConnection->disconnect();
        delete pConnection;
        setDisconnected(s);
      }
    }
  } catch (std::exception &) {}
}